

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall
QMainWindowLayout::hover(QMainWindowLayout *this,QLayoutItem *hoverTarget,QPoint *mousePos)

{
  QLayout *_sep;
  _func_int **pp_Var1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QDockAreaLayoutItem *pQVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  undefined1 uVar12;
  undefined7 uVar13;
  Data *pDVar14;
  QDebug QVar15;
  undefined1 auVar16 [8];
  Data *this_00;
  undefined1 **ppuVar17;
  bool bVar18;
  char cVar19;
  compare_eq_result_container<QList<int>,_int> cVar20;
  int iVar21;
  DockWidgetArea DVar22;
  DockWidgetAreas DVar23;
  Shape SVar24;
  ToolBarAreas TVar25;
  QWidget *pQVar26;
  undefined4 extraout_var;
  long lVar27;
  QWidget *pQVar28;
  QWidgetPrivate *pQVar29;
  QScreen *pQVar30;
  QScreen *pQVar31;
  QDockWidget *pQVar32;
  QLoggingCategory *pQVar33;
  QWidget *pQVar34;
  QDockWidgetGroupWindow *pQVar35;
  QMainWindowLayoutState *pQVar36;
  undefined8 *puVar37;
  QToolBar *this_01;
  QSize QVar38;
  QTabBar *pQVar39;
  QPoint QVar40;
  uint uVar41;
  undefined8 *puVar42;
  QArrayDataPointer<QDockAreaLayoutItem> *pQVar43;
  QLayoutItem *pQVar44;
  QLayout *pQVar45;
  int iVar46;
  DockPosition _dockPos;
  const_iterator __begin2;
  long lVar47;
  QArrayDataPointer<QToolBarAreaLayoutLine> *this_02;
  Orientation *this_03;
  long in_FS_OFFSET;
  QRect QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QPoint pos;
  QWidget *w;
  QVarLengthArray<QWidget_*,_10LL> candidates;
  undefined8 auStack_7c0 [4];
  undefined1 auStack_79f [8];
  undefined1 auStack_797 [15];
  undefined8 auStack_788 [9];
  undefined4 auStack_740 [140];
  code *pcStack_510;
  QWidget *local_500;
  QLayoutItem *local_4f8;
  QPoint *local_4f0;
  QLayout *local_4e8;
  QMainWindowLayoutState *local_4e0;
  undefined8 *local_4d8;
  QArrayData *local_4d0;
  QArrayDataPointer<int> local_4c8;
  QPoint local_4a8;
  QArrayData *local_4a0;
  undefined1 local_498 [8];
  QArrayData *local_490;
  undefined1 local_488 [8];
  undefined1 local_480 [8];
  undefined1 local_478 [16];
  QDebug local_468;
  undefined1 local_460 [8];
  undefined1 local_458 [8];
  QDebug local_450;
  QDebug local_448;
  undefined1 local_440 [8];
  QDebug local_438;
  undefined1 local_430 [8];
  QList<QDockWidget_*> local_428;
  QDebug local_408;
  undefined1 local_400 [8];
  QDebug local_3f8;
  QDebug local_3f0;
  undefined1 local_3e8 [40];
  QMainWindow *local_3c0;
  undefined1 local_3b8 [224];
  bool local_2d8;
  DockWidgetArea local_2d0 [2];
  DockWidgetArea aDStack_2c8 [2];
  undefined1 local_2c0 [16];
  QLayoutItem *local_2b0;
  QMainWindow *pQStack_2a8;
  undefined1 local_2a0 [416];
  QArrayDataPointer<QDockAreaLayoutItem> local_100 [2];
  Int local_d0;
  bool local_cc;
  QArrayData *local_c8;
  QWidget **local_c0;
  _func_int **local_b8;
  undefined1 local_a8 [8];
  QWidget *pQStack_a0;
  undefined1 **local_98;
  undefined1 *puStack_90;
  QLayoutItem *local_88;
  QMainWindow *pQStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  int *local_68;
  Data *pDStack_60;
  QWidget **local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcStack_510 = (code *)0x43f5ec;
  pQVar44 = hoverTarget;
  pQVar26 = QLayout::parentWidget((QLayout *)this);
  iVar46 = (int)pQVar44;
  if ((pQVar26->data->widget_attributes & 0x8000) == 0) goto LAB_0043f60a;
  pcStack_510 = (code *)0x43f5fe;
  pQVar26 = QLayout::parentWidget((QLayout *)this);
  pcStack_510 = (code *)0x43f606;
  bVar18 = QWidget::isMinimized(pQVar26);
  if (((bVar18) || (hoverTarget == (QLayoutItem *)0x0)) || (*(long *)(this + 0x7d8) != 0))
  goto LAB_0043f60a;
  pcStack_510 = (code *)0x43f651;
  local_4f0 = mousePos;
  iVar21 = (*hoverTarget->_vptr_QLayoutItem[0xd])(hoverTarget);
  pQVar26 = (QWidget *)CONCAT44(extraout_var,iVar21);
  pcStack_510 = (code *)0x43f65c;
  QWidget::raise(pQVar26,iVar46);
  local_500 = pQVar26;
  local_4f8 = hoverTarget;
  local_4e8 = (QLayout *)this;
  if (((byte)this[0x700] & 0x20) != 0) {
    pcStack_510 = (code *)0x43f687;
    lVar27 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (lVar27 == 0) {
      pcStack_510 = (code *)0x43f69b;
      lVar27 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar27 == 0) goto LAB_0043f9cc;
    }
    local_98 = &puStack_90;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8 = (undefined1  [8])&DAT_0000000a;
    pQStack_a0 = (QWidget *)0x0;
    pcStack_510 = (code *)0x43f6f5;
    pQVar28 = QLayout::parentWidget((QLayout *)this);
    lVar27 = *(long *)&pQVar28->field_0x8;
    local_4d0 = *(QArrayData **)(lVar27 + 0x18);
    puVar37 = *(undefined8 **)(lVar27 + 0x20);
    lVar27 = *(long *)(lVar27 + 0x28);
    if (local_4d0 != (QArrayData *)0x0) {
      LOCK();
      (local_4d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_4d0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar27 != 0) {
      puVar42 = puVar37 + lVar27;
      local_4d8 = puVar42;
      do {
        pQVar28 = (QWidget *)*puVar37;
        if (pQVar28 == (QWidget *)0x0) {
          local_428.d.d = (Data *)(QWidget *)0x0;
        }
        else {
          local_428.d.d = (Data *)(QWidget *)0x0;
          if ((*(byte *)(*(long *)&pQVar28->field_0x8 + 0x30) & 1) != 0) {
            local_428.d.d = (Data *)pQVar28;
          }
        }
        if ((QWidget *)local_428.d.d != (QWidget *)0x0) {
          pcStack_510 = (code *)0x43f769;
          lVar27 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
          if (lVar27 == 0) {
            pcStack_510 = (code *)0x43f77e;
            lVar27 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
            if (lVar27 == 0) goto LAB_0043f8fa;
          }
          if ((((QWidget *)local_428.d.d != pQVar26) &&
              ((((*(QWidgetData **)((long)local_428.d.d + 0x20))->window_flags).
                super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
               1) != 0)) &&
             (((*(QWidgetData **)((long)local_428.d.d + 0x20))->widget_attributes & 0x8000) != 0)) {
            pcStack_510 = (code *)0x43f7ad;
            bVar18 = QWidget::isMinimized((QWidget *)local_428.d.d);
            if (!bVar18) {
              if ((undefined1  [8])pQStack_a0 == local_a8) {
                local_3e8._0_4_ = SUB84(local_428.d.d,0);
                local_3e8._4_4_ = (undefined4)((ulong)local_428.d.d >> 0x20);
                pcStack_510 = (code *)0x43f7f5;
                QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                          ((QVLABase<QWidget*> *)local_a8,10,&puStack_90,(QWidget **)local_3e8);
              }
              else {
                pcStack_510 = (code *)0x43f819;
                QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
                          ((QVLABase<QWidget*> *)local_a8,10,&puStack_90,(QWidget **)&local_428);
              }
            }
          }
          pcStack_510 = (code *)0x43f829;
          lVar27 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
          if (lVar27 != 0) {
            local_4e0 = *(QMainWindowLayoutState **)(*(long *)(lVar27 + 8) + 0x18);
            lVar27 = *(long *)(*(long *)(lVar27 + 8) + 0x28);
            if (local_4e0 != (QMainWindowLayoutState *)0x0) {
              LOCK();
              (local_4e0->rect).x1.m_i = (local_4e0->rect).x1.m_i + 1;
              UNLOCK();
            }
            if (lVar27 != 0) {
              lVar47 = 0;
              do {
                pcStack_510 = (code *)0x43f867;
                pQVar26 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
                if (((pQVar26 != local_500 && pQVar26 != (QWidget *)0x0) &&
                    (((pQVar26->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) &&
                   ((pQVar26->data->widget_attributes & 0x8000) != 0)) {
                  pcStack_510 = (code *)0x43f894;
                  bVar18 = QWidget::isMinimized(pQVar26);
                  if (!bVar18) {
                    local_3e8._0_4_ = SUB84(pQVar26,0);
                    local_3e8._4_4_ = (undefined4)((ulong)pQVar26 >> 0x20);
                    pcStack_510 = (code *)0x43f8c2;
                    QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                              ((QVLABase<QWidget*> *)local_a8,10,&puStack_90,(QWidget **)local_3e8);
                  }
                }
                lVar47 = lVar47 + 8;
              } while (lVar27 << 3 != lVar47);
            }
            puVar42 = local_4d8;
            pQVar26 = local_500;
            if (local_4e0 != (QMainWindowLayoutState *)0x0) {
              LOCK();
              (local_4e0->rect).x1.m_i = (local_4e0->rect).x1.m_i + -1;
              UNLOCK();
              if ((local_4e0->rect).x1.m_i == 0) {
                pcStack_510 = (code *)0x43f8fa;
                QArrayData::deallocate((QArrayData *)local_4e0,8,0x10);
              }
            }
          }
        }
LAB_0043f8fa:
        puVar37 = puVar37 + 1;
      } while (puVar37 != puVar42);
    }
    ppuVar17 = local_98;
    if (pQStack_a0 != (QWidget *)0x0) {
      lVar27 = (long)pQStack_a0 << 3;
      lVar47 = 0;
LAB_0043f923:
      pQVar28 = *(QWidget **)((long)ppuVar17 + lVar47);
      pcStack_510 = (code *)0x43f92f;
      pQVar29 = qt_widget_private(pQVar26);
      pcStack_510 = (code *)0x43f937;
      pQVar30 = QWidgetPrivate::associatedScreen(pQVar29);
      pcStack_510 = (code *)0x43f942;
      pQVar29 = qt_widget_private(pQVar28);
      pcStack_510 = (code *)0x43f94a;
      pQVar31 = QWidgetPrivate::associatedScreen(pQVar29);
      if (((pQVar30 != pQVar31) && (pQVar30 != (QScreen *)0x0)) && (pQVar31 != (QScreen *)0x0))
      goto LAB_0043f975;
      pcStack_510 = (code *)0x43f96d;
      cVar19 = QRect::contains((QPoint *)&pQVar28->data->crect,SUB81(local_4f0,0));
      if (cVar19 == '\0') goto LAB_0043f975;
      pcStack_510 = (code *)0x43fe44;
      pQVar28 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
      pQVar44 = local_4f8;
      if (pQVar28 == (QWidget *)0x0) goto LAB_0044109b;
      pcStack_510 = (code *)0x43fe5d;
      pQVar34 = QDockWidget::widget((QDockWidget *)pQVar28);
      iVar46 = (int)pQVar34;
      pcStack_510 = (code *)0x43fe6f;
      lVar27 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      pQVar45 = local_4e8;
      if (lVar27 != 0) goto LAB_00440ead;
      pcStack_510 = (code *)0x43fe85;
      pQVar35 = createTabbedDockWindow((QMainWindowLayout *)local_4e8);
      pcStack_510 = (code *)0x43fe98;
      QWidget::setGeometry(&pQVar35->super_QWidget,&pQVar28->data->crect);
      pcStack_510 = (code *)0x43fea0;
      pQVar36 = (QMainWindowLayoutState *)QWidget::layout(&pQVar35->super_QWidget);
      pcStack_510 = (code *)0x43feab;
      SVar24 = tabwidgetPositionToTabBarShape(pQVar28);
      local_4d8 = (undefined8 *)CONCAT44(local_4d8._4_4_,SVar24);
      pcStack_510 = (code *)0x43feba;
      DVar22 = dockWidgetArea((QMainWindowLayout *)pQVar45,pQVar28);
      bVar18 = false;
      _dockPos = LeftDock;
      switch(DVar22) {
      case LeftDockWidgetArea:
        goto switchD_0043fed8_caseD_1;
      case RightDockWidgetArea:
        _dockPos = RightDock;
        break;
      default:
        _dockPos = DockCount;
        bVar18 = true;
        goto switchD_0043fed8_caseD_1;
      case TopDockWidgetArea:
        _dockPos = TopDock;
        break;
      case BottomDockWidgetArea:
        _dockPos = BottomDock;
      }
      bVar18 = false;
switchD_0043fed8_caseD_1:
      this_03 = &(pQVar36->toolBarAreaLayout).docks[1].o;
      local_4e0 = pQVar36;
      if (bVar18) {
        pcStack_510 = (code *)0x440c49;
        DVar22 = dockWidgetArea((QMainWindowLayout *)local_4e8,pQVar26);
        _dockPos = DockCount;
        if (DVar22 - LeftDockWidgetArea < 8) {
          _dockPos = *(DockPosition *)(&DAT_006e8c50 + (ulong)(DVar22 - LeftDockWidgetArea) * 4);
        }
      }
      pQVar45 = local_4e8;
      if (_dockPos == DockCount) {
        _dockPos = RightDock;
      }
      _sep = local_4e8 + 0x1d;
      pcStack_510 = (code *)0x440c84;
      pQVar26 = QLayout::parentWidget(local_4e8);
      pcStack_510 = (code *)0x440ca4;
      QDockAreaLayoutInfo::QDockAreaLayoutInfo
                ((QDockAreaLayoutInfo *)local_3e8,(int *)_sep,_dockPos,Horizontal,(int)local_4d8,
                 (QMainWindow *)pQVar26);
      pcStack_510 = (code *)0x440cb4;
      QDockAreaLayoutInfo::operator=
                ((QDockAreaLayoutInfo *)this_03,(QDockAreaLayoutInfo *)local_3e8);
      pcStack_510 = (code *)0x440cc1;
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_3e8);
      pcStack_510 = (code *)0x440cc9;
      pQVar39 = getTabBar((QMainWindowLayout *)pQVar45);
      *(QTabBar **)&(local_4e0->toolBarAreaLayout).docks[3].rect = pQVar39;
      *(undefined1 *)&(local_4e0->toolBarAreaLayout).docks[3].lines.d.size = 1;
      pcStack_510 = (code *)0x440ce7;
      QDockAreaLayoutInfo::add((QDockAreaLayoutInfo *)this_03,pQVar28);
      pcStack_510 = (code *)0x440cfe;
      QDockAreaLayoutInfo::add
                ((QDockAreaLayoutInfo *)((long)pQVar45 + (ulong)_dockPos * 0x70 + 0x1e0),
                 &pQVar35->super_QWidget);
      pcStack_510 = (code *)0x440d09;
      QWidget::setParent(pQVar28,&pQVar35->super_QWidget);
      iVar46 = (int)pQVar35;
      pcStack_510 = (code *)0x440d0e;
      pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
      pQVar44 = local_4f8;
      pQVar26 = local_500;
      if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_3e8._24_8_ = pQVar33->name;
        local_3e8._0_4_ = 2;
        local_3e8._4_4_ = 0;
        local_3e8._8_4_ = 0;
        local_3e8._12_4_ = 0;
        local_3e8._16_4_ = 0;
        local_3e8._20_4_ = 0;
        pcStack_510 = (code *)0x440d4e;
        QMessageLogger::debug();
        QVar15.stream = local_3f0.stream;
        pcStack_510 = (code *)0x440d6d;
        QVar60.m_data = (storage_type *)0x8;
        QVar60.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar60);
        pcStack_510 = (code *)0x440d78;
        QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)&local_428);
        if ((QWidget *)local_428.d.d != (QWidget *)0x0) {
          LOCK();
          *(int *)local_428.d.d = *(int *)local_428.d.d + -1;
          UNLOCK();
          if (*(int *)local_428.d.d == 0) {
            pcStack_510 = (code *)0x440d9d;
            QArrayData::deallocate(&(local_428.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (*(QTextStream *)(local_3f0.stream + 0x30) == (QTextStream)0x1) {
          pcStack_510 = (code *)0x440dba;
          QTextStream::operator<<((QTextStream *)local_3f0.stream,' ');
        }
        local_480 = (undefined1  [8])local_3f0.stream;
        *(int *)(local_3f0.stream + 0x28) = *(int *)(local_3f0.stream + 0x28) + 1;
        pcStack_510 = (code *)0x440de0;
        ::operator<<((Stream *)&local_4c8,(QWidget *)local_480);
        pDVar14 = local_4c8.d;
        pcStack_510 = (code *)0x440dff;
        QVar61.m_data = (storage_type *)0x12;
        QVar61.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar61);
        pcStack_510 = (code *)0x440e0a;
        QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_428);
        if ((QWidget *)local_428.d.d != (QWidget *)0x0) {
          LOCK();
          *(int *)local_428.d.d = *(int *)local_428.d.d + -1;
          UNLOCK();
          if (*(int *)local_428.d.d == 0) {
            pcStack_510 = (code *)0x440e2f;
            QArrayData::deallocate(&(local_428.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_4c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          pcStack_510 = (code *)0x440e44;
          QTextStream::operator<<((QTextStream *)local_4c8.d,' ');
        }
        local_478._0_8_ = local_4c8.d;
        *(int *)&local_4c8.d[2].super_QArrayData.alloc =
             (int)local_4c8.d[2].super_QArrayData.alloc + 1;
        pcStack_510 = (code *)0x440e71;
        pQVar26 = (QWidget *)local_478;
        ::operator<<((Stream *)(local_478 + 8),(QWidget *)local_478);
        iVar46 = (int)pQVar26;
        pcStack_510 = (code *)0x440e79;
        QDebug::~QDebug((QDebug *)(local_478 + 8));
        pcStack_510 = (code *)0x440e81;
        QDebug::~QDebug((QDebug *)local_478);
        pcStack_510 = (code *)0x440e89;
        QDebug::~QDebug((QDebug *)&local_4c8);
        pcStack_510 = (code *)0x440e96;
        QDebug::~QDebug((QDebug *)local_480);
        pcStack_510 = (code *)0x440ea3;
        QDebug::~QDebug(&local_3f0);
        pQVar44 = local_4f8;
        pQVar26 = local_500;
      }
LAB_00440ead:
      pcStack_510 = (code *)0x440eb5;
      QWidget::show(pQVar28);
      pcStack_510 = (code *)0x440eba;
      pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_3e8._24_8_ = pQVar33->name;
        local_3e8._0_4_ = 2;
        local_3e8._4_4_ = 0;
        local_3e8._8_4_ = 0;
        local_3e8._12_4_ = 0;
        local_3e8._16_4_ = 0;
        local_3e8._20_4_ = 0;
        pcStack_510 = (code *)0x440ef7;
        QMessageLogger::debug();
        pDVar14 = local_4c8.d;
        pcStack_510 = (code *)0x440f16;
        QVar62.m_data = (storage_type *)0x7;
        QVar62.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar62);
        pcStack_510 = (code *)0x440f21;
        QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_428);
        if ((QWidget *)local_428.d.d != (QWidget *)0x0) {
          LOCK();
          *(int *)local_428.d.d = *(int *)local_428.d.d + -1;
          UNLOCK();
          if (*(int *)local_428.d.d == 0) {
            pcStack_510 = (code *)0x440f46;
            QArrayData::deallocate(&(local_428.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_4c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          pcStack_510 = (code *)0x440f5b;
          QTextStream::operator<<((QTextStream *)local_4c8.d,' ');
        }
        local_490 = &(local_4c8.d)->super_QArrayData;
        *(int *)&local_4c8.d[2].super_QArrayData.alloc =
             (int)local_4c8.d[2].super_QArrayData.alloc + 1;
        pcStack_510 = (code *)0x440f85;
        pQVar32 = (QDockWidget *)&local_490;
        ::operator<<((Stream *)local_488,(QDockWidget *)&local_490);
        iVar46 = (int)pQVar32;
        pcStack_510 = (code *)0x440f8d;
        QDebug::~QDebug((QDebug *)local_488);
        pcStack_510 = (code *)0x440f95;
        QDebug::~QDebug((QDebug *)&local_490);
        pcStack_510 = (code *)0x440f9d;
        QDebug::~QDebug((QDebug *)&local_4c8);
        pQVar44 = local_4f8;
        pQVar26 = local_500;
      }
      pcStack_510 = (code *)0x440faf;
      QWidget::raise(pQVar26,iVar46);
      pcStack_510 = (code *)0x440fb4;
      pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
      if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
        local_3e8._24_8_ = pQVar33->name;
        local_3e8._0_4_ = 2;
        local_3e8._4_4_ = 0;
        local_3e8._8_4_ = 0;
        local_3e8._12_4_ = 0;
        local_3e8._16_4_ = 0;
        local_3e8._20_4_ = 0;
        pcStack_510 = (code *)0x440ff1;
        QMessageLogger::debug();
        pDVar14 = local_4c8.d;
        pcStack_510 = (code *)0x441010;
        QVar63.m_data = (storage_type *)0x7;
        QVar63.m_size = (qsizetype)&local_428;
        QString::fromUtf8(QVar63);
        pcStack_510 = (code *)0x44101b;
        QTextStream::operator<<((QTextStream *)pDVar14,(QString *)&local_428);
        if ((QWidget *)local_428.d.d != (QWidget *)0x0) {
          LOCK();
          *(int *)local_428.d.d = *(int *)local_428.d.d + -1;
          UNLOCK();
          if (*(int *)local_428.d.d == 0) {
            pcStack_510 = (code *)0x441040;
            QArrayData::deallocate(&(local_428.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((char)local_4c8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          pcStack_510 = (code *)0x441055;
          QTextStream::operator<<((QTextStream *)local_4c8.d,' ');
        }
        local_4a0 = &(local_4c8.d)->super_QArrayData;
        *(int *)&local_4c8.d[2].super_QArrayData.alloc =
             (int)local_4c8.d[2].super_QArrayData.alloc + 1;
        pcStack_510 = (code *)0x44107e;
        ::operator<<((Stream *)local_498,(QWidget *)&local_4a0);
        pcStack_510 = (code *)0x441086;
        QDebug::~QDebug((QDebug *)local_498);
        pcStack_510 = (code *)0x44108e;
        QDebug::~QDebug((QDebug *)&local_4a0);
        pcStack_510 = (code *)0x441096;
        QDebug::~QDebug((QDebug *)&local_4c8);
        pQVar44 = local_4f8;
      }
LAB_0044109b:
      pcStack_510 = (code *)0x4410aa;
      pQVar35 = (QDockWidgetGroupWindow *)
                QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      pcStack_510 = (code *)0x4410ba;
      QVar40 = QWidget::mapFromGlobal((QWidget *)pQVar35,local_4f0);
      local_3e8._0_4_ = QVar40.xp.m_i;
      local_3e8._4_4_ = QVar40.yp.m_i;
      pcStack_510 = (code *)0x4410d0;
      bVar18 = QDockWidgetGroupWindow::hover
                         ((QDockWidgetGroupWindow *)pQVar35,pQVar44,(QPoint *)local_3e8);
      pQVar45 = local_4e8;
      if (bVar18) {
        pcStack_510 = (code *)0x4410e4;
        setCurrentHoveredFloat((QMainWindowLayout *)local_4e8,pQVar35);
        pcStack_510 = (code *)0x4410f8;
        applyState((QMainWindowLayout *)pQVar45,(QMainWindowLayoutState *)&pQVar45[4].field_0x8,true
                  );
      }
      if (local_4d0 != (QArrayData *)0x0) {
        LOCK();
        (local_4d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_4d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_4d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pcStack_510 = (code *)0x441116;
          QArrayData::deallocate(local_4d0,8,0x10);
        }
      }
      if (local_98 != &puStack_90) {
        pcStack_510 = (code *)0x441140;
        QtPrivate::sizedFree(local_98,(long)local_a8 << 3);
      }
      goto LAB_0043f60a;
    }
LAB_0043f97e:
    if (local_4d0 != (QArrayData *)0x0) {
      LOCK();
      (local_4d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_4d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_4d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pcStack_510 = (code *)0x43f99c;
        QArrayData::deallocate(local_4d0,8,0x10);
      }
    }
    this = (QMainWindowLayout *)local_4e8;
    hoverTarget = local_4f8;
    if (local_98 != &puStack_90) {
      pcStack_510 = (code *)0x43f9cc;
      QtPrivate::sizedFree(local_98,(long)local_a8 << 3);
    }
  }
LAB_0043f9cc:
  pp_Var1 = (((QLayout *)((long)this + 0x7e0))->super_QLayoutItem)._vptr_QLayoutItem;
  if (((pp_Var1 != (_func_int **)0x0) && (*(int *)((long)pp_Var1 + 4) != 0)) &&
     (*(long *)&(((QLayout *)((long)this + 0x7e0))->super_QLayoutItem).align != 0)) {
    pcStack_510 = (code *)0x43f9f8;
    QDockWidgetGroupWindow::destroyIfSingleItemLeft
              (*(QDockWidgetGroupWindow **)
                &(((QLayout *)((long)this + 0x7e0))->super_QLayoutItem).align);
  }
  pcStack_510 = (code *)0x43fa02;
  setCurrentHoveredFloat(this,(QDockWidgetGroupWindow *)0x0);
  local_4e0 = (QMainWindowLayoutState *)&((QLayout *)((long)this + 0x80))->field_0x8;
  ((QLayout *)((long)this + 0x3a0))->field_0x4 = 0;
  local_4a8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_510 = (code *)0x43fa2c;
  pQVar26 = QLayout::parentWidget((QLayout *)this);
  pcStack_510 = (code *)0x43fa39;
  local_4a8 = QWidget::mapFromGlobal(pQVar26,local_4f0);
  pQVar36 = (QMainWindowLayoutState *)((long)this + 0x3c0);
  if ((*(int *)&((QLayout *)((long)this + 0x3c0))->field_0x8 < *(int *)((long)this + 0x3c0)) ||
     (*(int *)&((QLayout *)((long)this + 0x3c0))->field_0xc <
      *(int *)&((QLayout *)((long)this + 0x3c0))->field_0x4)) {
    (((QLayout *)((long)this + 0x3c0))->super_QLayoutItem)._vptr_QLayoutItem =
         ((QLayoutItem *)&local_4e0->mainWindow)->_vptr_QLayoutItem;
    RVar9.m_i = (local_4e0->rect).y1.m_i;
    RVar10.m_i = (local_4e0->rect).x2.m_i;
    RVar11.m_i = (local_4e0->rect).y2.m_i;
    (pQVar36->rect).x1 = (Representation)(local_4e0->rect).x1.m_i;
    (pQVar36->rect).y1 = (Representation)RVar9.m_i;
    *(int *)&((QLayout *)((long)this + 0x3c0))->field_0x8 = RVar10.m_i;
    *(int *)&((QLayout *)((long)this + 0x3c0))->field_0xc = RVar11.m_i;
    *(_func_int ***)&((QLayout *)((long)this + 0x3e0))->field_0x8 =
         (((QLayout *)((long)this + 0xa0))->super_QLayoutItem)._vptr_QLayoutItem;
    uVar12 = ((QLayout *)((long)this + 0xa0))->field_0x8;
    uVar13 = *(undefined7 *)&((QLayout *)((long)this + 0xa0))->field_0x9;
    *(undefined8 *)&(((QLayout *)((long)this + 0x3c0))->super_QLayoutItem).align =
         *(undefined8 *)((long)this + 0xa0);
    ((QLayout *)((long)this + 0x3e0))->super_QObject = (QObject)uVar12;
    *(undefined7 *)&((QLayout *)((long)this + 0x3e0))->field_0x1 = uVar13;
    this_02 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)
              &((QLayout *)((long)this + 0x3e0))->super_QLayoutItem;
    lVar27 = 4;
    do {
      pcStack_510 = (code *)0x43fab1;
      QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                (this_02,(QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_02[-0x23].size);
      uVar3 = *(undefined8 *)((long)&this_02[-0x21].d + 1);
      uVar4 = *(undefined8 *)((long)&this_02[-0x21].ptr + 1);
      this_02[1].d = (Data *)this_02[-0x22].size;
      this_02[1].ptr = (QToolBarAreaLayoutLine *)this_02[-0x21].d;
      *(undefined8 *)((long)&this_02[1].ptr + 1) = uVar3;
      *(undefined8 *)((long)&this_02[1].size + 1) = uVar4;
      this_02 = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&this_02[2].ptr;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    *(char *)&(((QLayout *)((long)this + 0x4c0))->super_QLayoutItem)._vptr_QLayoutItem =
         (char)(((QLayout *)((long)this + 0x180))->super_QLayoutItem).align.
               super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i;
    uVar12 = ((QLayout *)((long)this + 0x1a0))->field_0x8;
    uVar13 = *(undefined7 *)&((QLayout *)((long)this + 0x1a0))->field_0x9;
    *(undefined8 *)&(((QLayout *)((long)this + 0x4c0))->super_QLayoutItem).align =
         *(undefined8 *)((long)this + 0x1a0);
    ((QLayout *)((long)this + 0x4e0))->super_QObject = (QObject)uVar12;
    *(undefined7 *)&((QLayout *)((long)this + 0x4e0))->field_0x1 = uVar13;
    pp_Var1 = *(_func_int ***)&(((QLayout *)((long)this + 0x1a0))->super_QLayoutItem).align;
    *(_func_int ***)&((QLayout *)((long)this + 0x4e0))->field_0x8 =
         (((QLayout *)((long)this + 0x1a0))->super_QLayoutItem)._vptr_QLayoutItem;
    (((QLayout *)((long)this + 0x4e0))->super_QLayoutItem)._vptr_QLayoutItem = pp_Var1;
    uVar12 = ((QLayout *)((long)this + 0x1c0))->field_0x8;
    uVar13 = *(undefined7 *)&((QLayout *)((long)this + 0x1c0))->field_0x9;
    *(undefined8 *)&(((QLayout *)((long)this + 0x4e0))->super_QLayoutItem).align =
         *(undefined8 *)((long)this + 0x1c0);
    ((QLayout *)((long)this + 0x500))->super_QObject = (QObject)uVar12;
    *(undefined7 *)&((QLayout *)((long)this + 0x500))->field_0x1 = uVar13;
    pp_Var1 = *(_func_int ***)&(((QLayout *)((long)this + 0x1c0))->super_QLayoutItem).align;
    *(_func_int ***)&((QLayout *)((long)this + 0x500))->field_0x8 =
         (((QLayout *)((long)this + 0x1c0))->super_QLayoutItem)._vptr_QLayoutItem;
    (((QLayout *)((long)this + 0x500))->super_QLayoutItem)._vptr_QLayoutItem = pp_Var1;
    lVar27 = 0;
    do {
      *(undefined8 *)
       ((long)&(((QLayout *)((long)this + 0x500))->super_QLayoutItem).align.
               super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27) =
           *(undefined8 *)(&((QLayout *)((long)this + 0x1e0))->super_QObject + lVar27);
      pcStack_510 = (code *)0x43fb46;
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)
                 (&((QLayout *)((long)this + 0x520))->super_QObject + lVar27),
                 (QArrayDataPointer<QWidget_*> *)
                 (&((QLayout *)((long)this + 0x1e0))->field_0x8 + lVar27));
      uVar3 = *(undefined8 *)(&((QLayout *)((long)this + 0x200))->field_0x8 + lVar27);
      uVar4 = *(undefined8 *)
               ((long)&(((QLayout *)((long)this + 0x200))->super_QLayoutItem)._vptr_QLayoutItem +
               lVar27);
      uVar5 = *(undefined8 *)
               ((long)&(((QLayout *)((long)this + 0x200))->super_QLayoutItem).align.
                       super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27);
      *(undefined8 *)
       ((long)&(((QLayout *)((long)this + 0x520))->super_QLayoutItem).align.
               super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27) =
           *(undefined8 *)(&((QLayout *)((long)this + 0x200))->super_QObject + lVar27);
      *(undefined8 *)(&((QLayout *)((long)this + 0x540))->super_QObject + lVar27) = uVar3;
      *(undefined8 *)(&((QLayout *)((long)this + 0x540))->field_0x8 + lVar27) = uVar4;
      *(undefined8 *)
       ((long)&(((QLayout *)((long)this + 0x540))->super_QLayoutItem)._vptr_QLayoutItem + lVar27) =
           uVar5;
      pQVar43 = (QArrayDataPointer<QDockAreaLayoutItem> *)
                ((long)&(((QLayout *)((long)this + 0x540))->super_QLayoutItem).align.
                        super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                        super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27);
      pcStack_510 = (code *)0x43fb7a;
      QArrayDataPointer<QDockAreaLayoutItem>::operator=
                (pQVar43,(QArrayDataPointer<QDockAreaLayoutItem> *)
                         (&((QLayout *)((long)this + 0x220))->super_QObject + lVar27));
      pQVar6 = *(QDockAreaLayoutItem **)(&((QLayout *)((long)this + 0x240))->super_QObject + lVar27)
      ;
      pQVar43[1].d = *(Data **)((long)&(((QLayout *)((long)this + 0x220))->super_QLayoutItem).align.
                                       super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                       super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27);
      pQVar43[1].ptr = pQVar6;
      *(undefined4 *)&pQVar43[1].size =
           *(undefined4 *)(&((QLayout *)((long)this + 0x240))->field_0x8 + lVar27);
      lVar27 = lVar27 + 0x70;
    } while (lVar27 != 0x1c0);
    (((QLayout *)((long)this + 0x6c0))->super_QLayoutItem).field_0xc =
         ((QLayout *)((long)this + 0x3a0))->field_0x4;
    (((QLayout *)((long)this + 0x6c0))->super_QLayoutItem).align.
    super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         *(Int *)((long)this + 0x3a0);
    pcStack_510 = (code *)0x43fbca;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)((long)this + 0x6e0),
               (QArrayDataPointer<QWidget_*> *)&((QLayout *)((long)this + 0x3a0))->field_0x8);
    hoverTarget = local_4f8;
  }
  local_4c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_4c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_4c8.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_510 = (code *)0x43fc05;
  QMainWindowLayoutState::gapIndex((QList<int> *)&local_4c8,pQVar36,local_500,&local_4a8);
  pQVar45 = (QLayout *)this;
  if ((undefined1 *)local_4c8.size != (undefined1 *)0x0) {
    pcStack_510 = (code *)0x43fc1d;
    DVar22 = QDockWidgetPrivate::toDockWidgetArea(local_4c8.ptr[1]);
    pcStack_510 = (code *)0x43fc2e;
    pQVar32 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    local_4f0 = (QPoint *)CONCAT44(local_4f0._4_4_,DVar22);
    if (pQVar32 != (QDockWidget *)0x0) {
      pcStack_510 = (code *)0x43fc46;
      DVar23 = QDockWidget::allowedAreas(pQVar32);
      bVar18 = (DVar22 & ~(uint)DVar23.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
                                super_QFlagsStorage<Qt::DockWidgetArea>.i) == NoDockWidgetArea;
      DVar22 = (DockWidgetArea)bVar18;
      if (!bVar18) {
        pcStack_510 = (code *)0x43fc59;
        pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) {
          DVar22 = NoDockWidgetArea;
        }
        else {
          local_3e8._24_8_ = pQVar33->name;
          local_3e8._0_4_ = 2;
          local_3e8._4_4_ = 0;
          local_3e8._8_4_ = 0;
          local_3e8._12_4_ = 0;
          local_3e8._16_4_ = 0;
          local_3e8._20_4_ = 0;
          pcStack_510 = (code *)0x43fc99;
          QMessageLogger::debug();
          QVar15.stream = local_408.stream;
          pcStack_510 = (code *)0x43fcb9;
          QVar49.m_data = (storage_type *)0x23;
          QVar49.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar49);
          pcStack_510 = (code *)0x43fcc4;
          QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
          if (local_a8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a8 = *(int *)local_a8 + -1;
            UNLOCK();
            if (*(int *)local_a8 == 0) {
              pcStack_510 = (code *)0x43fce9;
              QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
            }
          }
          if (*(QTextStream *)(local_408.stream + 0x30) == (QTextStream)0x1) {
            pcStack_510 = (code *)0x43fd01;
            QTextStream::operator<<((QTextStream *)local_408.stream,' ');
          }
          local_400 = (undefined1  [8])local_408.stream;
          *(int *)(local_408.stream + 0x28) = *(int *)(local_408.stream + 0x28) + 1;
          pcStack_510 = (code *)0x43fd2c;
          ::operator<<((Stream *)&local_428,(QWidget *)local_400);
          this_00 = local_428.d.d;
          pcStack_510 = (code *)0x43fd4c;
          QVar50.m_data = &DAT_0000000a;
          QVar50.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar50);
          pcStack_510 = (code *)0x43fd57;
          QTextStream::operator<<((QTextStream *)this_00,(QString *)local_a8);
          if (local_a8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a8 = *(int *)local_a8 + -1;
            UNLOCK();
            if (*(int *)local_a8 == 0) {
              pcStack_510 = (code *)0x43fd7c;
              QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
            }
          }
          if (((QWidget *)((long)local_428.d.d + 0x28))->field_0x8 == '\x01') {
            pcStack_510 = (code *)0x43fd94;
            QTextStream::operator<<((QTextStream *)local_428.d.d,' ');
          }
          local_3f8.stream = (Stream *)local_428.d.d;
          iVar46 = *(int *)((long)local_428.d.d + 0x28);
          *(int *)((long)local_428.d.d + 0x28) = iVar46 + 1;
          local_a8 = (undefined1  [8])local_428.d.d;
          *(int *)((long)local_428.d.d + 0x28) = iVar46 + 2;
          pcStack_510 = (code *)0x43fdea;
          qt_QMetaEnum_flagDebugOperator
                    (&local_3f0,(ulonglong)local_a8,(QMetaObject *)((ulong)local_4f0 & 0xffffffff),
                     (char *)&Qt::staticMetaObject);
          pcStack_510 = (code *)0x43fdf2;
          QDebug::~QDebug((QDebug *)local_a8);
          pcStack_510 = (code *)0x43fdfa;
          QDebug::~QDebug(&local_3f0);
          pcStack_510 = (code *)0x43fe02;
          QDebug::~QDebug(&local_3f8);
          pcStack_510 = (code *)0x43fe0a;
          QDebug::~QDebug((QDebug *)&local_428);
          pcStack_510 = (code *)0x43fe17;
          QDebug::~QDebug((QDebug *)local_400);
          pcStack_510 = (code *)0x43fe24;
          QDebug::~QDebug(&local_408);
          DVar22 = NoDockWidgetArea;
          hoverTarget = local_4f8;
        }
      }
    }
    if (pQVar32 == (QDockWidget *)0x0) {
      pcStack_510 = (code *)0x43ff02;
      puVar37 = (undefined8 *)
                QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (puVar37 != (undefined8 *)0x0) {
        local_428.d.d = (Data *)0x0;
        local_428.d.ptr = (QDockWidget **)0x0;
        local_428.d.size = 0;
        pcStack_510 = (code *)0x43ff48;
        local_4d8 = puVar37;
        qt_qFindChildren_helper
                  (puVar37,0,0x8000000000000000,&QDockWidget::staticMetaObject,&local_428,0);
        if (local_428.d.size == 1) {
          pcStack_510 = (code *)0x43ff63;
          DVar23 = QDockWidget::allowedAreas((QDockWidget *)*(WId *)local_428.d.ptr);
          bVar18 = ((uint)local_4f0 &
                   ~(uint)DVar23.super_QFlagsStorageHelper<Qt::DockWidgetArea,_4>.
                          super_QFlagsStorage<Qt::DockWidgetArea>.i) == 0;
          DVar22 = (DockWidgetArea)bVar18;
          if (!bVar18) {
            pcStack_510 = (code *)0x43ff78;
            pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
            if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) {
              DVar22 = NoDockWidgetArea;
            }
            else {
              local_3e8._24_8_ = pQVar33->name;
              local_3e8._0_4_ = 2;
              local_3e8._4_4_ = 0;
              local_3e8._8_4_ = 0;
              local_3e8._12_4_ = 0;
              local_3e8._16_4_ = 0;
              local_3e8._20_4_ = 0;
              pcStack_510 = (code *)0x43ffb8;
              QMessageLogger::debug();
              QVar15.stream = local_448.stream;
              pcStack_510 = (code *)0x43ffd7;
              QVar51.m_data = (storage_type *)0x27;
              QVar51.m_size = (qsizetype)local_a8;
              QString::fromUtf8(QVar51);
              pcStack_510 = (code *)0x43ffe2;
              QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
              if (local_a8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)local_a8 = *(int *)local_a8 + -1;
                UNLOCK();
                if (*(int *)local_a8 == 0) {
                  pcStack_510 = (code *)0x440007;
                  QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
                }
              }
              if (*(QTextStream *)(local_448.stream + 0x30) == (QTextStream)0x1) {
                pcStack_510 = (code *)0x44001f;
                QTextStream::operator<<((QTextStream *)local_448.stream,' ');
              }
              local_440 = (undefined1  [8])local_448.stream;
              *(int *)(local_448.stream + 0x28) = *(int *)(local_448.stream + 0x28) + 1;
              pcStack_510 = (code *)0x44004a;
              ::operator<<((Stream *)&local_438,(QWidget *)local_440);
              QVar15.stream = local_438.stream;
              pcStack_510 = (code *)0x440069;
              QVar52.m_data = &DAT_0000000a;
              QVar52.m_size = (qsizetype)local_a8;
              QString::fromUtf8(QVar52);
              pcStack_510 = (code *)0x440074;
              QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
              if (local_a8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)local_a8 = *(int *)local_a8 + -1;
                UNLOCK();
                if (*(int *)local_a8 == 0) {
                  pcStack_510 = (code *)0x440099;
                  QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
                }
              }
              if (*(QTextStream *)(local_438.stream + 0x30) == (QTextStream)0x1) {
                pcStack_510 = (code *)0x4400b1;
                QTextStream::operator<<((QTextStream *)local_438.stream,' ');
              }
              local_430 = (undefined1  [8])local_438.stream;
              iVar46 = *(int *)(local_438.stream + 0x28);
              *(int *)(local_438.stream + 0x28) = iVar46 + 1;
              local_a8 = (undefined1  [8])local_438.stream;
              *(int *)(local_438.stream + 0x28) = iVar46 + 2;
              pcStack_510 = (code *)0x440108;
              qt_QMetaEnum_flagDebugOperator
                        (&local_408,(ulonglong)local_a8,
                         (QMetaObject *)((ulong)local_4f0 & 0xffffffff),
                         (char *)&Qt::staticMetaObject);
              pcStack_510 = (code *)0x440110;
              QDebug::~QDebug((QDebug *)local_a8);
              pcStack_510 = (code *)0x440118;
              QDebug::~QDebug(&local_408);
              pcStack_510 = (code *)0x440120;
              QDebug::~QDebug((QDebug *)local_430);
              pcStack_510 = (code *)0x440128;
              QDebug::~QDebug(&local_438);
              pcStack_510 = (code *)0x440135;
              QDebug::~QDebug((QDebug *)local_440);
              pcStack_510 = (code *)0x440142;
              QDebug::~QDebug(&local_448);
              DVar22 = NoDockWidgetArea;
              hoverTarget = local_4f8;
            }
          }
        }
        else {
          pcStack_510 = (code *)0x440153;
          pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_3e8._24_8_ = pQVar33->name;
            local_3e8._0_4_ = 2;
            local_3e8._4_4_ = 0;
            local_3e8._8_4_ = 0;
            local_3e8._12_4_ = 0;
            local_3e8._16_4_ = 0;
            local_3e8._20_4_ = 0;
            pcStack_510 = (code *)0x440193;
            QMessageLogger::debug();
            QVar15.stream = local_438.stream;
            pcStack_510 = (code *)0x4401b2;
            QVar53.m_data = (storage_type *)0x15;
            QVar53.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar53);
            pcStack_510 = (code *)0x4401bd;
            QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
            if (local_a8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a8 = *(int *)local_a8 + -1;
              UNLOCK();
              if (*(int *)local_a8 == 0) {
                pcStack_510 = (code *)0x4401e2;
                QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
              }
            }
            if (*(QTextStream *)(local_438.stream + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x4401fa;
              QTextStream::operator<<((QTextStream *)local_438.stream,' ');
            }
            local_430 = (undefined1  [8])local_438.stream;
            *(int *)(local_438.stream + 0x28) = *(int *)(local_438.stream + 0x28) + 1;
            pcStack_510 = (code *)0x440225;
            ::operator<<((Stream *)&local_408,(QWidget *)local_430);
            QVar15.stream = local_408.stream;
            pcStack_510 = (code *)0x440244;
            QVar54.m_data = (storage_type *)0x3;
            QVar54.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar54);
            pcStack_510 = (code *)0x44024f;
            QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
            if (local_a8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a8 = *(int *)local_a8 + -1;
              UNLOCK();
              if (*(int *)local_a8 == 0) {
                pcStack_510 = (code *)0x440274;
                QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
              }
            }
            if (*(QTextStream *)(local_408.stream + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x44028c;
              QTextStream::operator<<((QTextStream *)local_408.stream,' ');
            }
            pcStack_510 = (code *)0x4402a1;
            QTextStream::operator<<((QTextStream *)local_408.stream,local_428.d.size);
            if (*(QTextStream *)(local_408.stream + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x4402b9;
              QTextStream::operator<<((QTextStream *)local_408.stream,' ');
            }
            QVar15.stream = local_408.stream;
            pcStack_510 = (code *)0x4402dd;
            QVar55.m_data = (storage_type *)0x9;
            QVar55.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar55);
            pcStack_510 = (code *)0x4402e8;
            QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
            if (local_a8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a8 = *(int *)local_a8 + -1;
              UNLOCK();
              if (*(int *)local_a8 == 0) {
                pcStack_510 = (code *)0x44030d;
                QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
              }
            }
            hoverTarget = local_4f8;
            if (*(QTextStream *)(local_408.stream + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x44032a;
              QTextStream::operator<<((QTextStream *)local_408.stream,' ');
            }
            pcStack_510 = (code *)0x440337;
            QDebug::~QDebug(&local_408);
            pcStack_510 = (code *)0x440344;
            QDebug::~QDebug((QDebug *)local_430);
            pcStack_510 = (code *)0x440351;
            QDebug::~QDebug(&local_438);
          }
          pcStack_510 = (code *)0x440356;
          pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
          if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_3e8._24_8_ = pQVar33->name;
            local_3e8._0_4_ = 2;
            local_3e8._4_4_ = 0;
            local_3e8._8_4_ = 0;
            local_3e8._12_4_ = 0;
            local_3e8._16_4_ = 0;
            local_3e8._20_4_ = 0;
            pcStack_510 = (code *)0x440396;
            QMessageLogger::debug();
            local_a8 = (undefined1  [8])local_438.stream;
            local_438.stream = (Stream *)0x0;
            pcStack_510 = (code *)0x4403ce;
            QtPrivate::printSequentialContainer<QList<QDockWidget*>>
                      ((QtPrivate *)&local_408,(Stream *)local_a8,"QList",&local_428);
            hoverTarget = local_4f8;
            pcStack_510 = (code *)0x4403db;
            QDebug::~QDebug((QDebug *)local_a8);
            pcStack_510 = (code *)0x4403e3;
            QDebug::~QDebug(&local_408);
            pcStack_510 = (code *)0x4403eb;
            QDebug::~QDebug(&local_438);
          }
          pcStack_510 = (code *)0x4403f0;
          pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
          DVar22 = LeftDockWidgetArea;
          if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
            local_3e8._24_8_ = pQVar33->name;
            local_3e8._0_4_ = 2;
            local_3e8._4_4_ = 0;
            local_3e8._8_4_ = 0;
            local_3e8._12_4_ = 0;
            local_3e8._16_4_ = 0;
            local_3e8._20_4_ = 0;
            pcStack_510 = (code *)0x440433;
            QMessageLogger::debug();
            auVar16 = local_460;
            pcStack_510 = (code *)0x440452;
            QVar56.m_data = (storage_type *)0x15;
            QVar56.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar56);
            pcStack_510 = (code *)0x44045d;
            QTextStream::operator<<((QTextStream *)auVar16,(QString *)local_a8);
            if (local_a8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a8 = *(int *)local_a8 + -1;
              UNLOCK();
              if (*(int *)local_a8 == 0) {
                pcStack_510 = (code *)0x440482;
                QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
              }
            }
            if (*(QTextStream *)((long)local_460 + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x44049a;
              QTextStream::operator<<((QTextStream *)local_460,' ');
            }
            local_458 = local_460;
            *(int *)((long)local_460 + 0x28) = *(int *)((long)local_460 + 0x28) + 1;
            pcStack_510 = (code *)0x4404c5;
            ::operator<<((Stream *)&local_450,(QWidget *)local_458);
            QVar15.stream = local_450.stream;
            pcStack_510 = (code *)0x4404e4;
            QVar57.m_data = &DAT_0000000b;
            QVar57.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar57);
            pcStack_510 = (code *)0x4404ef;
            QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
            if (local_a8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a8 = *(int *)local_a8 + -1;
              UNLOCK();
              if (*(int *)local_a8 == 0) {
                pcStack_510 = (code *)0x440514;
                QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
              }
            }
            if (*(QTextStream *)(local_450.stream + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x44052c;
              QTextStream::operator<<((QTextStream *)local_450.stream,' ');
            }
            local_448.stream = local_450.stream;
            iVar46 = *(int *)(local_450.stream + 0x28);
            *(int *)(local_450.stream + 0x28) = iVar46 + 1;
            local_a8 = (undefined1  [8])local_450.stream;
            *(int *)(local_450.stream + 0x28) = iVar46 + 2;
            pcStack_510 = (code *)0x44057b;
            qt_QMetaEnum_flagDebugOperator
                      ((QDebug *)local_440,(ulonglong)local_a8,
                       (QMetaObject *)((ulong)local_4f0 & 0xffffffff),(char *)&Qt::staticMetaObject)
            ;
            pcStack_510 = (code *)0x440583;
            QDebug::~QDebug((QDebug *)local_a8);
            auVar16 = local_440;
            pcStack_510 = (code *)0x4405a3;
            QVar58.m_data = (storage_type *)0x12;
            QVar58.m_size = (qsizetype)local_a8;
            QString::fromUtf8(QVar58);
            pcStack_510 = (code *)0x4405ae;
            QTextStream::operator<<((QTextStream *)auVar16,(QString *)local_a8);
            if (local_a8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)local_a8 = *(int *)local_a8 + -1;
              UNLOCK();
              if (*(int *)local_a8 == 0) {
                pcStack_510 = (code *)0x4405d3;
                QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
              }
            }
            hoverTarget = local_4f8;
            if (*(QTextStream *)((long)local_440 + 0x30) == (QTextStream)0x1) {
              pcStack_510 = (code *)0x4405f0;
              QTextStream::operator<<((QTextStream *)local_440,' ');
            }
            pcStack_510 = (code *)0x4405fd;
            QDebug::~QDebug((QDebug *)local_440);
            pcStack_510 = (code *)0x44060a;
            QDebug::~QDebug(&local_448);
            pcStack_510 = (code *)0x440617;
            QDebug::~QDebug(&local_450);
            pcStack_510 = (code *)0x440624;
            QDebug::~QDebug((QDebug *)local_458);
            pcStack_510 = (code *)0x440631;
            QDebug::~QDebug((QDebug *)local_460);
          }
        }
        puVar37 = local_4d8;
        if ((QWidget *)local_428.d.d != (QWidget *)0x0) {
          LOCK();
          *(int *)local_428.d.d = *(int *)local_428.d.d + -1;
          UNLOCK();
          if (*(int *)local_428.d.d == 0) {
            pcStack_510 = (code *)0x44065e;
            QArrayData::deallocate(&(local_428.d.d)->super_QArrayData,8,0x10);
            puVar37 = local_4d8;
          }
        }
      }
      if (puVar37 == (undefined8 *)0x0) {
        pcStack_510 = (code *)0x440671;
        pQVar33 = QtPrivateLogging::lcQpaDockWidgets();
        if (((pQVar33->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0) {
          DVar22 = NoDockWidgetArea;
        }
        else {
          local_3e8._24_8_ = pQVar33->name;
          local_3e8._0_4_ = 2;
          local_3e8._4_4_ = 0;
          local_3e8._8_4_ = 0;
          local_3e8._12_4_ = 0;
          local_3e8._16_4_ = 0;
          local_3e8._20_4_ = 0;
          pcStack_510 = (code *)0x4406b1;
          QMessageLogger::debug();
          QVar15.stream = local_468.stream;
          pcStack_510 = (code *)0x4406d0;
          QVar59.m_data = (storage_type *)0x39;
          QVar59.m_size = (qsizetype)local_a8;
          QString::fromUtf8(QVar59);
          pcStack_510 = (code *)0x4406db;
          QTextStream::operator<<((QTextStream *)QVar15.stream,(QString *)local_a8);
          if (local_a8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)local_a8 = *(int *)local_a8 + -1;
            UNLOCK();
            if (*(int *)local_a8 == 0) {
              pcStack_510 = (code *)0x440700;
              QArrayData::deallocate((QArrayData *)local_a8,2,0x10);
            }
          }
          if (*(QTextStream *)(local_468.stream + 0x30) == (QTextStream)0x1) {
            pcStack_510 = (code *)0x440718;
            QTextStream::operator<<((QTextStream *)local_468.stream,' ');
          }
          local_460 = (undefined1  [8])local_468.stream;
          *(int *)(local_468.stream + 0x28) = *(int *)(local_468.stream + 0x28) + 1;
          pcStack_510 = (code *)0x440749;
          ::operator<<((Stream *)&local_450,(QWidget *)local_460);
          local_a8 = (undefined1  [8])local_450.stream;
          *(int *)(local_450.stream + 0x28) = *(int *)(local_450.stream + 0x28) + 1;
          pcStack_510 = (code *)0x440781;
          qt_QMetaEnum_flagDebugOperator
                    ((QDebug *)&local_428,(ulonglong)local_a8,
                     (QMetaObject *)((ulong)local_4f0 & 0xffffffff),(char *)&Qt::staticMetaObject);
          pcStack_510 = (code *)0x440789;
          QDebug::~QDebug((QDebug *)local_a8);
          pcStack_510 = (code *)0x440791;
          QDebug::~QDebug((QDebug *)&local_428);
          pcStack_510 = (code *)0x440799;
          QDebug::~QDebug(&local_450);
          pcStack_510 = (code *)0x4407a1;
          QDebug::~QDebug((QDebug *)local_460);
          pcStack_510 = (code *)0x4407ae;
          QDebug::~QDebug(&local_468);
          DVar22 = NoDockWidgetArea;
          hoverTarget = local_4f8;
        }
      }
    }
    pcStack_510 = (code *)0x4407ca;
    this_01 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
    if (this_01 != (QToolBar *)0x0) {
      uVar41 = 0xffffffff;
      if ((ulong)(uint)local_4c8.ptr[1] < 4) {
        uVar41 = *(uint *)(&DAT_006e8440 + (ulong)(uint)local_4c8.ptr[1] * 4);
      }
      pcStack_510 = (code *)0x4407f4;
      TVar25 = QToolBar::allowedAreas(this_01);
      DVar22 = (DockWidgetArea)
               (((uint)TVar25.super_QFlagsStorageHelper<Qt::ToolBarArea,_4>.
                       super_QFlagsStorage<Qt::ToolBarArea>.i | uVar41) == 0xffffffff);
    }
    pQVar45 = local_4e8;
    if ((DVar22 & LeftDockWidgetArea) == NoDockWidgetArea) {
      pcStack_510 = (code *)0x440812;
      QList<int>::clear((QList<int> *)&local_4c8);
    }
  }
  pQVar44 = &pQVar45[0x3d].super_QLayoutItem;
  pcStack_510 = (code *)0x440826;
  cVar20 = QList<int>::operator==((QList<int> *)&local_4c8,(QList<int> *)pQVar44);
  if (!cVar20) {
    pcStack_510 = (code *)0x44083e;
    QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)pQVar44,&local_4c8);
    if ((undefined1 *)local_4c8.size == (undefined1 *)0x0) {
      pcStack_510 = (code *)0x440bd5;
      fixToolBarOrientation(hoverTarget,2);
      pcStack_510 = (code *)0x440be2;
      restore((QMainWindowLayout *)pQVar45,true);
    }
    else {
      pcStack_510 = (code *)0x440862;
      fixToolBarOrientation
                (hoverTarget,*(int *)(*(long *)&pQVar45[0x3d].super_QLayoutItem.align + 4));
      pp_Var1 = (((QLayout *)((long)this + 0x3c0))->super_QLayoutItem)._vptr_QLayoutItem;
      local_3e8._16_4_ = SUB84(pp_Var1,0);
      local_3e8._20_4_ = (undefined4)((ulong)pp_Var1 >> 0x20);
      uVar7 = (pQVar36->rect).x1;
      uVar8 = (pQVar36->rect).y1;
      local_3e8._8_4_ = (undefined4)*(undefined8 *)&((QLayout *)((long)this + 0x3c0))->field_0x8;
      local_3e8._12_4_ =
           (undefined4)((ulong)*(undefined8 *)&((QLayout *)((long)this + 0x3c0))->field_0x8 >> 0x20)
      ;
      pcStack_510 = (code *)0x440890;
      local_3e8._0_4_ = uVar7;
      local_3e8._4_4_ = uVar8;
      memset(local_3b8,0xaa,0x308);
      local_3e8._24_8_ = *(undefined8 *)&pQVar45[0x1e].super_QLayoutItem.align;
      local_3e8._32_8_ = *(undefined8 *)(pQVar45 + 0x1f);
      local_3c0 = *(QMainWindow **)&pQVar45[0x1f].field_0x8;
      lVar27 = 0x408;
      do {
        piVar2 = *(int **)((long)pQVar45 + lVar27 + -0x18);
        *(int **)((long)auStack_7c0 + lVar27) = piVar2;
        *(undefined8 *)((long)auStack_7c0 + lVar27 + 8) =
             *(undefined8 *)((long)pQVar45 + lVar27 + -0x10);
        *(undefined8 *)((long)auStack_7c0 + lVar27 + 0x10) =
             *(undefined8 *)((long)pQVar45 + lVar27 + -8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        uVar3 = *(undefined8 *)(&pQVar45->super_QObject + lVar27);
        uVar4 = *(undefined8 *)(&pQVar45->super_QObject + lVar27 + 8);
        uVar5 = *(undefined8 *)((long)(&pQVar45->field_0x9 + lVar27) + 8);
        *(undefined8 *)(auStack_79f + lVar27) = *(undefined8 *)(&pQVar45->field_0x9 + lVar27);
        *(undefined8 *)(auStack_797 + lVar27) = uVar5;
        *(undefined8 *)((long)auStack_7c0 + lVar27 + 0x18) = uVar3;
        *(undefined8 *)(&stack0xfffffffffffff860 + lVar27) = uVar4;
        lVar27 = lVar27 + 0x38;
      } while (lVar27 != 0x4e8);
      local_2d8 = *(bool *)&pQVar45[0x26].super_QLayoutItem._vptr_QLayoutItem;
      local_2d0[0] = *(DockWidgetArea *)&pQVar45[0x26].super_QLayoutItem.align;
      local_2d0[1] = *(DockWidgetArea *)&pQVar45[0x26].super_QLayoutItem.field_0xc;
      aDStack_2c8 = *(DockWidgetArea (*) [2])(pQVar45 + 0x27);
      local_2c0._0_4_ = *(int *)&pQVar45[0x27].field_0x8;
      local_2c0._4_4_ = *(int *)&pQVar45[0x27].field_0xc;
      local_2c0._8_8_ = pQVar45[0x27].super_QLayoutItem._vptr_QLayoutItem;
      local_2b0 = *(QLayoutItem **)&pQVar45[0x27].super_QLayoutItem.align;
      pQStack_2a8 = *(QMainWindow **)(pQVar45 + 0x28);
      local_2a0._0_4_ = *(int *)&pQVar45[0x28].field_0x8;
      local_2a0._4_4_ = *(int *)&pQVar45[0x28].field_0xc;
      local_2a0._8_8_ = pQVar45[0x28].super_QLayoutItem._vptr_QLayoutItem;
      lVar27 = 0x518;
      do {
        *(undefined8 *)((long)auStack_7c0 + lVar27 + 0x18) =
             *(undefined8 *)(&pQVar45->super_QObject + lVar27);
        piVar2 = *(int **)(&pQVar45->field_0x8 + lVar27);
        *(int **)(&stack0xfffffffffffff860 + lVar27) = piVar2;
        *(undefined8 *)(auStack_79f + lVar27 + 7) =
             *(undefined8 *)((long)&(pQVar45->super_QLayoutItem)._vptr_QLayoutItem + lVar27);
        *(undefined8 *)(auStack_797 + lVar27 + 7) =
             *(undefined8 *)
              ((long)&(pQVar45->super_QLayoutItem).align.
                      super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        uVar3 = *(undefined8 *)(&pQVar45[1].super_QObject + lVar27);
        uVar4 = *(undefined8 *)(&pQVar45[1].super_QObject + lVar27 + 8);
        puVar37 = (undefined8 *)((long)&pQVar45[1].super_QLayoutItem._vptr_QLayoutItem + lVar27);
        uVar5 = puVar37[1];
        *(undefined8 *)((long)auStack_788 + lVar27 + 0x10) = *puVar37;
        *(undefined8 *)((long)auStack_788 + lVar27 + 0x18) = uVar5;
        *(undefined8 *)((long)auStack_788 + lVar27) = uVar3;
        *(undefined8 *)((long)auStack_788 + lVar27 + 8) = uVar4;
        piVar2 = *(int **)(&pQVar45[2].super_QObject + lVar27);
        *(int **)((long)auStack_788 + lVar27 + 0x20) = piVar2;
        *(undefined8 *)((long)auStack_788 + lVar27 + 0x28) =
             *(undefined8 *)(&pQVar45[2].field_0x8 + lVar27);
        *(undefined8 *)((long)auStack_788 + lVar27 + 0x30) =
             *(undefined8 *)((long)&pQVar45[2].super_QLayoutItem._vptr_QLayoutItem + lVar27);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        *(undefined4 *)((long)auStack_740 + lVar27) =
             *(undefined4 *)(&pQVar45[3].field_0x8 + lVar27);
        puVar37 = (undefined8 *)
                  ((long)&pQVar45[2].super_QLayoutItem.align.
                          super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                          super_QFlagsStorage<Qt::AlignmentFlag>.i + lVar27);
        uVar3 = puVar37[1];
        *(undefined8 *)((long)auStack_788 + lVar27 + 0x38) = *puVar37;
        *(undefined8 *)((long)auStack_788 + lVar27 + 0x40) = uVar3;
        lVar27 = lVar27 + 0x70;
      } while (lVar27 != 0x6d8);
      local_cc = (bool)pQVar45[0x36].super_QLayoutItem.field_0xc;
      local_d0 = pQVar45[0x36].super_QLayoutItem.align.
                 super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i;
      local_c8 = *(QArrayData **)(pQVar45 + 0x37);
      local_c0 = *(QWidget ***)&pQVar45[0x37].field_0x8;
      local_b8 = pQVar45[0x37].super_QLayoutItem._vptr_QLayoutItem;
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pcStack_510 = (code *)0x440a64;
      bVar18 = QMainWindowLayoutState::insertGap
                         ((QMainWindowLayoutState *)local_3e8,(QList<int> *)&local_4c8,local_4f8);
      if (bVar18) {
        pcStack_510 = (code *)0x440a7c;
        QVar38 = QMainWindowLayoutState::minimumSize((QMainWindowLayoutState *)local_3e8);
        if (((local_3e8._8_4_ - local_3e8._0_4_) + 1 < QVar38.wd.m_i.m_i) ||
           ((local_3e8._12_4_ - local_3e8._4_4_) + 1 < QVar38.ht.m_i.m_i)) goto LAB_00440b2f;
        pcStack_510 = (code *)0x440abb;
        QMainWindowLayoutState::fitLayout((QMainWindowLayoutState *)local_3e8);
        pcStack_510 = (code *)0x440ac6;
        QVar48 = QMainWindowLayoutState::gapRect
                           ((QMainWindowLayoutState *)local_3e8,(QList<int> *)pQVar44);
        *(QRect *)&pQVar45[0x3e].field_0x8 = QVar48;
        pcStack_510 = (code *)0x440adc;
        pQVar26 = QLayout::parentWidget(pQVar45);
        pcStack_510 = (code *)0x440af2;
        QDockAreaLayout::separatorRegion((QDockAreaLayout *)local_a8);
        pcStack_510 = (code *)0x440afd;
        QWidget::update(pQVar26,(QRegion *)local_a8);
        pcStack_510 = (code *)0x440b05;
        QRegion::~QRegion((QRegion *)local_a8);
        pQVar36 = local_4e0;
        pcStack_510 = (code *)0x440b15;
        QMainWindowLayoutState::operator=(local_4e0,(QMainWindowLayoutState *)local_3e8);
        pcStack_510 = (code *)0x440b25;
        applyState((QMainWindowLayout *)pQVar45,pQVar36,true);
        pcStack_510 = (code *)0x440b2d;
        updateGapIndicator((QMainWindowLayout *)pQVar45);
      }
      else {
LAB_00440b2f:
        pcStack_510 = (code *)0x440b3c;
        restore((QMainWindowLayout *)pQVar45,true);
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pcStack_510 = (code *)0x440b65;
          QArrayData::deallocate(local_c8,8,0x10);
        }
      }
      lVar27 = -0x1c0;
      pQVar43 = local_100;
      do {
        pcStack_510 = (code *)0x440b7c;
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(pQVar43);
        piVar2 = (int *)pQVar43[-3].size;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pcStack_510 = (code *)0x440b9d;
            QArrayData::deallocate((QArrayData *)pQVar43[-3].size,8,0x10);
          }
        }
        pQVar43 = (QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar43[-5].ptr;
        lVar27 = lVar27 + 0x70;
      } while (lVar27 != 0);
      lVar27 = 0xd8;
      do {
        pcStack_510 = (code *)0x440bbc;
        QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer
                  ((QArrayDataPointer<QToolBarAreaLayoutLine> *)(local_3e8 + lVar27));
        lVar27 = lVar27 + -0x38;
      } while (lVar27 != -8);
    }
  }
  if (&(local_4c8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_4c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      pcStack_510 = (code *)0x440c0d;
      QArrayData::deallocate(&(local_4c8.d)->super_QArrayData,4,0x10);
    }
  }
LAB_0043f60a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  pcStack_510 = tabwidgetPositionToTabBarShape;
  __stack_chk_fail();
LAB_0043f975:
  lVar47 = lVar47 + 8;
  if (lVar27 == lVar47) goto LAB_0043f97e;
  goto LAB_0043f923;
}

Assistant:

void QMainWindowLayout::hover(QLayoutItem *hoverTarget,
                              const QPoint &mousePos) {
  if (!parentWidget()->isVisible() || parentWidget()->isMinimized() ||
      pluggingWidget != nullptr || hoverTarget == nullptr)
    return;

  QWidget *widget = hoverTarget->widget();

#if QT_CONFIG(dockwidget)
    widget->raise();
    if ((dockOptions & QMainWindow::GroupedDragging) && (qobject_cast<QDockWidget*>(widget)
            || qobject_cast<QDockWidgetGroupWindow *>(widget))) {

        // Check if we are over another floating dock widget
        QVarLengthArray<QWidget *, 10> candidates;
        const auto siblings = parentWidget()->children();
        for (QObject *c : siblings) {
            QWidget *w = qobject_cast<QWidget*>(c);
            if (!w)
                continue;

            // Handle only dock widgets and group windows
            if (!qobject_cast<QDockWidget*>(w) && !qobject_cast<QDockWidgetGroupWindow *>(w))
                continue;

            // Check permission to dock on another dock widget or floating dock
            // FIXME in Qt 7

            if (w != widget && w->isWindow() && w->isVisible() && !w->isMinimized())
                candidates << w;

            if (QDockWidgetGroupWindow *group = qobject_cast<QDockWidgetGroupWindow *>(w)) {
                // floating QDockWidgets have a QDockWidgetGroupWindow as a parent,
                // if they have been hovered over
                const auto groupChildren = group->children();
                for (QObject *c : groupChildren) {
                    if (QDockWidget *dw = qobject_cast<QDockWidget*>(c)) {
                        if (dw != widget && dw->isFloating() && dw->isVisible() && !dw->isMinimized())
                            candidates << dw;
                    }
                }
            }
        }

        for (QWidget *w : candidates) {
            const QScreen *screen1 = qt_widget_private(widget)->associatedScreen();
            const QScreen *screen2 = qt_widget_private(w)->associatedScreen();
            if (screen1 && screen2 && screen1 != screen2)
                continue;
            if (!w->geometry().contains(mousePos))
                continue;

#if QT_CONFIG(tabwidget)
            if (auto dropTo = qobject_cast<QDockWidget *>(w)) {

                // w is the drop target's widget
                w = dropTo->widget();

                // Create a floating tab, unless already existing
                if (!qobject_cast<QDockWidgetGroupWindow *>(w)) {
                    QDockWidgetGroupWindow *floatingTabs = createTabbedDockWindow();
                    floatingTabs->setGeometry(dropTo->geometry());
                    QDockAreaLayoutInfo *info = floatingTabs->layoutInfo();
                    const QTabBar::Shape shape = tabwidgetPositionToTabBarShape(dropTo);

                    // dropTo and widget may be in a state where they transition
                    // from being a group window child to a single floating dock widget.
                    // In that case, their path to a main window dock may not have been
                    // updated yet.
                    // => ask both and fall back to dock 1 (right dock)
                    QInternal::DockPosition dockPosition = toDockPos(dockWidgetArea(dropTo));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = toDockPos(dockWidgetArea(widget));
                    if (dockPosition == QInternal::DockPosition::DockCount)
                        dockPosition = QInternal::DockPosition::RightDock;

                    *info = QDockAreaLayoutInfo(&layoutState.dockAreaLayout.sep, dockPosition,
                                                Qt::Horizontal, shape,
                                                static_cast<QMainWindow *>(parentWidget()));
                    info->tabBar = getTabBar();
                    info->tabbed = true;
                    info->add(dropTo);
                    QDockAreaLayoutInfo &parentInfo = layoutState.dockAreaLayout.docks[dockPosition];
                    parentInfo.add(floatingTabs);
                    dropTo->setParent(floatingTabs);
                    qCDebug(lcQpaDockWidgets) << "Wrapping" << widget << "into floating tabs" << floatingTabs;
                    w = floatingTabs;
                }

                // Show the drop target and raise widget to foreground
                dropTo->show();
                qCDebug(lcQpaDockWidgets) << "Showing" << dropTo;
                widget->raise();
                qCDebug(lcQpaDockWidgets) << "Raising" << widget;
            }
#endif
            auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(w);
            Q_ASSERT(groupWindow);
            if (groupWindow->hover(hoverTarget, groupWindow->mapFromGlobal(mousePos))) {
                setCurrentHoveredFloat(groupWindow);
                applyState(layoutState); // update the tabbars
            }
            return;
        }
    }

    // If a temporary group window has been created during a hover,
    // remove it, if it has only one dockwidget child
    if (currentHoveredFloat)
        currentHoveredFloat->destroyIfSingleItemLeft();

    setCurrentHoveredFloat(nullptr);
    layoutState.dockAreaLayout.fallbackToSizeHints = false;
#endif // QT_CONFIG(dockwidget)

    QPoint pos = parentWidget()->mapFromGlobal(mousePos);

    if (!savedState.isValid())
        savedState = layoutState;

    QList<int> path = savedState.gapIndex(widget, pos);

    if (!path.isEmpty()) {
        bool allowed = false;

#if QT_CONFIG(dockwidget)
        allowed = isAreaAllowed(widget, path);
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            allowed = tb->isAreaAllowed(toToolBarArea(path.at(1)));
#endif

        if (!allowed)
            path.clear();
    }

    if (path == currentGapPos)
        return; // the gap is already there

    currentGapPos = path;
    if (path.isEmpty()) {
        fixToolBarOrientation(hoverTarget, 2); // 2 = top dock, ie. horizontal
        restore(true);
        return;
    }

    fixToolBarOrientation(hoverTarget, currentGapPos.at(1));

    QMainWindowLayoutState newState = savedState;

    if (!newState.insertGap(path, hoverTarget)) {
        restore(true); // not enough space
        return;
    }

    QSize min = newState.minimumSize();
    QSize size = newState.rect.size();

    if (min.width() > size.width() || min.height() > size.height()) {
        restore(true);
        return;
    }

    newState.fitLayout();

    currentGapRect = newState.gapRect(currentGapPos);

#if QT_CONFIG(dockwidget)
    parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#endif
    layoutState = std::move(newState);
    applyState(layoutState);

    updateGapIndicator();
}